

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

EbmlElement * __thiscall
libebml::EbmlMaster::FindFirstElt(EbmlMaster *this,EbmlCallbacks *Callbacks,bool bCreateIfNull)

{
  int iVar1;
  pointer ppEVar2;
  undefined4 extraout_var;
  EbmlElement *pEVar3;
  ulong uVar4;
  EbmlElement *local_28;
  
  ppEVar2 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->ElementList).
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar2) {
    uVar4 = 0;
    do {
      if (ppEVar2[uVar4] != (EbmlElement *)0x0) {
        iVar1 = (*ppEVar2[uVar4]->_vptr_EbmlElement[3])();
        if ((Callbacks->GlobalId->Length == *(size_t *)((uint32 *)CONCAT44(extraout_var,iVar1) + 2))
           && (Callbacks->GlobalId->Value == *(uint32 *)CONCAT44(extraout_var,iVar1))) {
          return (this->ElementList).
                 super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4];
        }
      }
      uVar4 = uVar4 + 1;
      ppEVar2 = (this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->ElementList).
                                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3))
    ;
  }
  if (bCreateIfNull) {
    pEVar3 = (*Callbacks->Create)();
    local_28 = pEVar3;
    std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
    emplace_back<libebml::EbmlElement*>
              ((vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
               &this->ElementList,&local_28);
  }
  else {
    pEVar3 = (EbmlElement *)0x0;
  }
  return pEVar3;
}

Assistant:

EbmlElement *EbmlMaster::FindFirstElt(const EbmlCallbacks & Callbacks, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (ElementList[Index] && EbmlId(*(ElementList[Index])) == EBML_INFO_ID(Callbacks))
      return ElementList[Index];
  }

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}